

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadSmt.c
# Opt level: O0

void Smt_PrsReadLines(Smt_Prs_t *p)

{
  char *pcVar1;
  char *pLim;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint n;
  Vec_Int_t *pVVar5;
  bool bVar6;
  int iToken;
  char *pStart;
  int fFirstTime;
  Smt_Prs_t *p_local;
  
  bVar2 = true;
  iVar3 = Vec_IntSize(&p->vStack);
  if (iVar3 != 0) {
    __assert_fail("Vec_IntSize(&p->vStack) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcReadSmt.c"
                  ,0x674,"void Smt_PrsReadLines(Smt_Prs_t *)");
  }
  iVar3 = Vec_WecSize(&p->vObjs);
  if (iVar3 != 0) {
    __assert_fail("Vec_WecSize(&p->vObjs) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcReadSmt.c"
                  ,0x676,"void Smt_PrsReadLines(Smt_Prs_t *)");
  }
  iVar3 = Vec_WecSize(&p->vObjs);
  Vec_IntPush(&p->vStack,iVar3);
  Vec_WecPushLevel(&p->vObjs);
  p->pCur = p->pBuffer;
  while (p->pCur < p->pLimit) {
    Smt_PrsSkipSpaces(p);
    if ((bVar2) && (*p->pCur == '|')) {
      bVar2 = false;
      *p->pCur = ' ';
      while( true ) {
        bVar6 = false;
        if (*p->pCur != '\0') {
          bVar6 = *p->pCur != '|';
        }
        if (!bVar6) break;
        pcVar1 = p->pCur;
        p->pCur = pcVar1 + 1;
        *pcVar1 = ' ';
      }
      if (*p->pCur == '|') {
        *p->pCur = ' ';
      }
    }
    else if (*p->pCur == '(') {
      iVar3 = Vec_IntEntryLast(&p->vStack);
      pVVar5 = Vec_WecEntry(&p->vObjs,iVar3);
      iVar3 = Vec_WecSize(&p->vObjs);
      iVar3 = Abc_Var2Lit(iVar3,0);
      Vec_IntPush(pVVar5,iVar3);
      iVar3 = Vec_WecSize(&p->vObjs);
      Vec_IntPush(&p->vStack,iVar3);
      Vec_WecPushLevel(&p->vObjs);
    }
    else if (*p->pCur == ')') {
      Vec_IntPop(&p->vStack);
    }
    else {
      pcVar1 = p->pCur;
      Smt_PrsSkipNonSpaces(p);
      if (p->pCur < p->pLimit) {
        pLim = p->pCur;
        p->pCur = pLim + -1;
        iVar3 = Abc_NamStrFindOrAddLim(p->pStrs,pcVar1,pLim,(int *)0x0);
        iVar4 = Vec_IntEntryLast(&p->vStack);
        pVVar5 = Vec_WecEntry(&p->vObjs,iVar4);
        iVar3 = Abc_Var2Lit(iVar3,1);
        Vec_IntPush(pVVar5,iVar3);
      }
    }
    p->pCur = p->pCur + 1;
  }
  iVar3 = Vec_IntSize(&p->vStack);
  if (iVar3 != 1) {
    __assert_fail("Vec_IntSize(&p->vStack) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcReadSmt.c"
                  ,0x6b1,"void Smt_PrsReadLines(Smt_Prs_t *)");
  }
  iVar3 = Vec_WecSize(&p->vObjs);
  iVar4 = Vec_WecCap(&p->vObjs);
  if (iVar3 != iVar4) {
    __assert_fail("Vec_WecSize(&p->vObjs) == Vec_WecCap(&p->vObjs)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcReadSmt.c"
                  ,0x6b2,"void Smt_PrsReadLines(Smt_Prs_t *)");
  }
  n = Vec_WecSize(&p->vObjs);
  iVar3 = Abc_Base16Log(n);
  p->nDigits = iVar3;
  return;
}

Assistant:

void Smt_PrsReadLines( Smt_Prs_t * p )
{
    int fFirstTime = 1;
    assert( Vec_IntSize(&p->vStack) == 0 );
    //assert( Vec_WecSize(&p->vDepth) == 0 );
    assert( Vec_WecSize(&p->vObjs) == 0 );
    // add top node at level 0
    //Vec_WecPushLevel( &p->vDepth );
    //Vec_WecPush( &p->vDepth, Vec_IntSize(&p->vStack), Vec_WecSize(&p->vObjs) );
    // add top node
    Vec_IntPush( &p->vStack, Vec_WecSize(&p->vObjs) );
    Vec_WecPushLevel( &p->vObjs );
    // add other nodes
    for ( p->pCur = p->pBuffer; p->pCur < p->pLimit; p->pCur++ )
    {
        Smt_PrsSkipSpaces( p );
        if ( fFirstTime && *p->pCur == '|' )
        {
            fFirstTime = 0;
            *p->pCur = ' ';
            while ( *p->pCur && *p->pCur != '|' )
                *p->pCur++ = ' ';
            if ( *p->pCur == '|' )
                *p->pCur = ' ';
            continue;
        }
        if ( *p->pCur == '(' )
        {
            // add new node at this depth
            //assert( Vec_WecSize(&p->vDepth) >= Vec_IntSize(&p->vStack) );
            //if ( Vec_WecSize(&p->vDepth) == Vec_IntSize(&p->vStack) )
            //    Vec_WecPushLevel(&p->vDepth);
            //Vec_WecPush( &p->vDepth, Vec_IntSize(&p->vStack), Vec_WecSize(&p->vObjs) );
            // add fanin to node on the previous level
            Vec_IntPush( Vec_WecEntry(&p->vObjs, Vec_IntEntryLast(&p->vStack)), Abc_Var2Lit(Vec_WecSize(&p->vObjs), 0) );            
            // add node to the stack
            Vec_IntPush( &p->vStack, Vec_WecSize(&p->vObjs) );
            Vec_WecPushLevel( &p->vObjs );
        }
        else if ( *p->pCur == ')' )
        {
            Vec_IntPop( &p->vStack );
        }
        else  // token
        {
            char * pStart = p->pCur; 
            Smt_PrsSkipNonSpaces( p );
            if ( p->pCur < p->pLimit )
            {
                // remove strange characters (this can lead to name clashes)
                int iToken;
                /* commented out for SMT comp
                char * pTemp;
                if ( *pStart == '?' )
                    *pStart = '_';
                for ( pTemp = pStart; pTemp < p->pCur; pTemp++ )
                    if ( *pTemp == '.' )
                        *pTemp = '_';*/
                // create and save token for this string
                iToken = Abc_NamStrFindOrAddLim( p->pStrs, pStart, p->pCur--, NULL );
                Vec_IntPush( Vec_WecEntry(&p->vObjs, Vec_IntEntryLast(&p->vStack)), Abc_Var2Lit(iToken, 1) );
            }
        }
    }
    assert( Vec_IntSize(&p->vStack) == 1 );
    assert( Vec_WecSize(&p->vObjs) == Vec_WecCap(&p->vObjs) );
    p->nDigits = Abc_Base16Log( Vec_WecSize(&p->vObjs) );
}